

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_Vx_annotation.cpp
# Opt level: O1

ON_OBSOLETE_V5_TextObject *
ON_OBSOLETE_V5_TextObject::CreateFromV2TextObject
          (ON_OBSOLETE_V2_TextObject *V2_text_object,ON_3dmAnnotationContext *annotation_context,
          ON_OBSOLETE_V5_TextObject *destination)

{
  bool bVar1;
  bool bVar2;
  ON_3dmAnnotationSettings *this;
  ON_DimStyle *src;
  long lVar3;
  ON_Plane *pOVar4;
  ON_Plane *pOVar5;
  byte bVar6;
  double dVar7;
  ON_Plane plane;
  ON_DimStyle dim_style;
  double local_538;
  double local_528;
  double local_520;
  ON_3dVector local_518;
  ON_Plane local_500;
  ON_DimStyle local_480;
  
  bVar6 = 0;
  if (annotation_context == (ON_3dmAnnotationContext *)0x0) {
    annotation_context = &ON_3dmAnnotationContext::Default;
  }
  this = ON_3dmAnnotationContext::AnnotationSettings(annotation_context);
  bVar1 = ON_3dmAnnotationContext::AnnotationSettingsAreSet(annotation_context);
  src = ON_3dmAnnotationContext::DimStyle(annotation_context);
  ON_DimStyle::ON_DimStyle(&local_480,src);
  bVar2 = ON_3dmAnnotationContext::DimStyleIsSet(annotation_context);
  if (destination == (ON_OBSOLETE_V5_TextObject *)0x0) {
    destination = (ON_OBSOLETE_V5_TextObject *)operator_new(0xe0);
    ON_OBSOLETE_V5_TextObject(destination);
  }
  ON_OBSOLETE_V5_Annotation::Internal_InitializeFromV2Annotation
            (&destination->super_ON_OBSOLETE_V5_Annotation,
             &V2_text_object->super_ON_OBSOLETE_V2_Annotation,annotation_context);
  (destination->super_ON_OBSOLETE_V5_Annotation).m_type = dtTextBlock;
  local_528 = 1.0;
  local_520 = 1.0;
  if (bVar2) {
    local_520 = ON_DimStyle::DimScale(&local_480);
  }
  local_538 = 1.0;
  if (bVar1) {
    bVar2 = ON_IsValid(this->m_dimscale);
    local_538 = 1.0;
    if (bVar2) {
      local_538 = 1.0;
      if (0.0 < this->m_dimscale) {
        local_538 = this->m_dimscale;
      }
    }
  }
  if (bVar1) {
    bVar1 = ON_3dmAnnotationSettings::Is_V5_AnnotationScalingEnabled(this);
    if (bVar1) {
      dVar7 = ON_3dmAnnotationSettings::WorldViewTextScale(this);
      if (0.0 < dVar7) {
        local_528 = ON_3dmAnnotationSettings::WorldViewTextScale(this);
      }
    }
  }
  dVar7 = (double)(~-(ulong)(0.0 < local_520) & 0x3ff0000000000000 |
                  (~-(ulong)(0.0 < local_528) & 0x3ff0000000000000 |
                  (ulong)((local_538 / local_520) * local_528) & -(ulong)(0.0 < local_528)) &
                  -(ulong)(0.0 < local_520));
  ON_OBSOLETE_V5_Annotation::SetHeight
            (&destination->super_ON_OBSOLETE_V5_Annotation,V2_text_object->m_height * dVar7);
  pOVar4 = &(V2_text_object->super_ON_OBSOLETE_V2_Annotation).m_plane;
  pOVar5 = &local_500;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pOVar5->origin).x = (pOVar4->origin).x;
    pOVar4 = (ON_Plane *)((long)pOVar4 + (ulong)bVar6 * -0x10 + 8);
    pOVar5 = (ON_Plane *)((long)pOVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  ::operator*(&local_518,dVar7 * V2_text_object->m_height * -1.11,&local_500.yaxis);
  ON_3dPoint::operator+=(&local_500.origin,&local_518);
  ON_Plane::UpdateEquation(&local_500);
  ON_OBSOLETE_V5_Annotation::SetPlane(&destination->super_ON_OBSOLETE_V5_Annotation,&local_500);
  ON_Plane::~ON_Plane(&local_500);
  ON_DimStyle::~ON_DimStyle(&local_480);
  return (ON_OBSOLETE_V5_TextObject *)&destination->super_ON_OBSOLETE_V5_Annotation;
}

Assistant:

ON_OBSOLETE_V5_TextObject* ON_OBSOLETE_V5_TextObject::CreateFromV2TextObject(
  const class ON_OBSOLETE_V2_TextObject& V2_text_object,
  const class ON_3dmAnnotationContext* annotation_context,
  ON_OBSOLETE_V5_TextObject* destination
)
{
  if (nullptr == annotation_context)
    annotation_context = &ON_3dmAnnotationContext::Default;

  const ON_3dmAnnotationSettings& annotation_settings = annotation_context->AnnotationSettings();
  const bool bAnnotationSettingsAreSet = annotation_context->AnnotationSettingsAreSet();

  const ON_DimStyle dim_style = annotation_context->DimStyle();
  const bool bDimStyleIsSet = annotation_context->DimStyleIsSet();

  ON_OBSOLETE_V5_TextObject* V5_text_object
    = (nullptr != destination)
    ? destination
    : new ON_OBSOLETE_V5_TextObject();
  V5_text_object->Internal_InitializeFromV2Annotation(V2_text_object, annotation_context);
  V5_text_object->m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock;

  const double dim_style_dim_scale
    = bDimStyleIsSet
    ? dim_style.DimScale()
    : 1.0;

  const double V2_dim_scale
    = (bAnnotationSettingsAreSet && ON_IsValid(annotation_settings.m_dimscale) && annotation_settings.m_dimscale > 0.0)
    ? annotation_settings.m_dimscale
    : 1.0;

  //const double dim_scale
  //  = (dim_style_dim_scale != V2_dim_scale && dim_style_dim_scale > 0.0 && V2_dim_scale > 0.0)
  //  ? V2_dim_scale / dim_style_dim_scale
  //  : 1.0;

  const double model_view_text_scale
    = (bAnnotationSettingsAreSet && annotation_settings.Is_V5_AnnotationScalingEnabled() && annotation_settings.WorldViewTextScale() > 0.0)
    ? annotation_settings.WorldViewTextScale()
    : 1.0;

  const double V2_to_V5_text_scale
    = (model_view_text_scale > 0.0 && V2_dim_scale > 0.0 && dim_style_dim_scale > 0.0)
    ? model_view_text_scale*(V2_dim_scale / dim_style_dim_scale)
    : 1.0;


  V5_text_object->SetHeight(V2_text_object.Height()*V2_to_V5_text_scale);

  // Adjust from top-left justified to baseline-justified
  // 13 November 2006 Dale Lear
  //    The code that was here only worked for text entities
  //    in the x-y plane.
  //plane.origin.y += -1.11 * pT->Height() * plane.yaxis.y;
  //plane.origin.x += 1.11 * pT->Height() * plane.xaxis.y;

  // works for any plane
  ON_Plane plane = V2_text_object.m_plane;
  plane.origin += -1.11 * (V2_text_object.Height()*V2_to_V5_text_scale) * plane.yaxis;
  plane.UpdateEquation();
  V5_text_object->SetPlane(plane);


  return V5_text_object;

}